

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBuffer.cpp
# Opt level: O1

void __thiscall Jupiter::DataBuffer::DataBuffer(DataBuffer *this,FILE *file,size_t size_)

{
  int iVar1;
  uint8_t *puVar2;
  
  this->bufferSize = size_;
  puVar2 = (uint8_t *)operator_new__(size_);
  this->base = puVar2;
  this->head = puVar2;
  this->end = puVar2 + size_;
  if (size_ != 0) {
    do {
      iVar1 = fgetc((FILE *)file);
      if (iVar1 == -1) {
        this->end = this->head + 1;
        break;
      }
      puVar2 = this->head;
      this->head = puVar2 + 1;
      *puVar2 = (uint8_t)iVar1;
    } while (this->head != this->end);
  }
  this->head = this->base;
  return;
}

Assistant:

Jupiter::DataBuffer::DataBuffer(FILE *file, size_t size_) {
	Jupiter::DataBuffer::bufferSize = size_;
	Jupiter::DataBuffer::base = new uint8_t[Jupiter::DataBuffer::bufferSize * sizeof(uint8_t)];
	Jupiter::DataBuffer::head = Jupiter::DataBuffer::base;
	Jupiter::DataBuffer::end = Jupiter::DataBuffer::head + Jupiter::DataBuffer::bufferSize;
	int chr;
	while (Jupiter::DataBuffer::head != Jupiter::DataBuffer::end) {
		chr = fgetc(file);
		if (chr == EOF) {
			Jupiter::DataBuffer::end = Jupiter::DataBuffer::head + 1;
			break;
		}
		*Jupiter::DataBuffer::head++ = static_cast<uint8_t>(chr);
	}
	Jupiter::DataBuffer::head = Jupiter::DataBuffer::base;
}